

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashtbl.c
# Opt level: O2

void test_hashtbl_set_get(void)

{
  int *piVar1;
  uint __line;
  cf_hashtbl_t *self;
  cf_size_t cVar2;
  int *piVar3;
  char *__assertion;
  long lVar4;
  int values [4];
  int keys [4];
  
  keys[0] = 0x1234;
  keys[1] = 0x5678;
  keys[2] = 0x9abc;
  keys[3] = 0xdef0;
  values[0] = 1;
  values[1] = 2;
  values[2] = 3;
  values[3] = 4;
  self = cf_hashtbl_new(0xf,cb);
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 4) {
    cf_hashtbl_set(self,(cf_void_t *)((long)keys + lVar4),4,(cf_void_t *)((long)values + lVar4));
  }
  cVar2 = cf_hashtbl_size(self);
  if (cVar2 == 4) {
    lVar4 = 0;
    do {
      if (lVar4 == 0x10) {
        cf_hashtbl_delete(self);
        return;
      }
      piVar3 = (int *)cf_hashtbl_get(self,(cf_void_t *)((long)keys + lVar4),4);
      piVar1 = (int *)((long)values + lVar4);
      lVar4 = lVar4 + 4;
    } while (*piVar3 == *piVar1);
    __assertion = "*(int*)cf_hashtbl_get(tbl, &keys[i], sizeof(int)) == values[i]";
    __line = 0x16;
  }
  else {
    __assertion = "cf_hashtbl_size(tbl) == cnt";
    __line = 0x13;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_hashtbl.c"
                ,__line,"void test_hashtbl_set_get()");
}

Assistant:

void test_hashtbl_set_get() {
    int keys[] = {0x1234, 0x5678, 0x9abc, 0xdef0};
    int values[] = {1, 2, 3, 4};
    cf_size_t i, cnt = 4;
    cf_hashtbl_t* tbl = cf_hashtbl_new(15, cb);
    for (i = 0; i < cnt; i++) {
        cf_hashtbl_set(tbl, &keys[i], sizeof(int), &values[i]);
    }

    cf_assert(cf_hashtbl_size(tbl) == cnt);

    for (i = 0; i < cnt; i++) {
        cf_assert(*(int*)cf_hashtbl_get(tbl, &keys[i], sizeof(int)) == values[i]);
    }
    cf_hashtbl_delete(tbl);
}